

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<long_double>_> *this)

{
  longdouble lVar1;
  complex<long_double> a;
  complex<long_double> *pcVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  complex<long_double> tmp2;
  complex<long_double> sum_1;
  int64_t k_1;
  int64_t j;
  complex<long_double> tmp;
  complex<long_double> sum;
  int64_t k;
  int64_t i;
  int64_t dim;
  complex<long_double> *pcVar7;
  complex<long_double> *pcVar8;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffc82;
  complex<long_double> *in_stack_fffffffffffffcb0;
  complex<long_double> *in_stack_fffffffffffffcc0;
  complex<long_double> *in_stack_fffffffffffffcc8;
  complex<long_double> *in_stack_fffffffffffffcd0;
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  complex<long_double> *local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  complex<long_double> *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [48];
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  complex<long_double> local_178;
  long local_158;
  complex<long_double> *local_150;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [64];
  undefined1 local_88 [64];
  complex<long_double> local_48;
  long local_28;
  complex<long_double> *local_20;
  long local_18;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 != iVar6) {
      Error(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_18 = CONCAT44(extraout_var,iVar4);
    for (local_20 = (complex<long_double> *)0x0; (long)local_20 < local_18;
        local_20 = (complex<long_double> *)(local_20->_M_value + 1)) {
      for (local_28 = 0; local_28 < (long)local_20; local_28 = local_28 + 1) {
        lVar1 = (longdouble)0;
        pcVar8 = SUB108(lVar1,0);
        uVar9 = (undefined2)((unkuint10)lVar1 >> 0x40);
        std::complex<long_double>::complex(&local_48,lVar1,lVar1);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_88,in_RDI,local_20,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_c8,in_RDI,local_20,local_28);
        std::conj<long_double>(in_stack_fffffffffffffcb0);
        std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc82,uVar9),pcVar8);
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc82,uVar9),pcVar8);
        in_stack_fffffffffffffcc8 = local_20;
        in_stack_fffffffffffffcd0 = local_20;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_108,in_RDI,local_20,local_20);
        std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc82,uVar9),pcVar8);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0,local_e8);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_148,in_RDI,local_20,local_20);
      std::sqrt<long_double>((complex<long_double> *)in_RDI);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_20,local_128);
      local_150 = local_20;
      while (local_150 = (complex<long_double> *)(local_150->_M_value + 1),
            (long)local_150 < local_18) {
        for (local_158 = 0; local_158 < (long)local_20; local_158 = local_158 + 1) {
          lVar1 = (longdouble)0;
          pcVar7 = SUB108(lVar1,0);
          uVar9 = (undefined2)((unkuint10)lVar1 >> 0x40);
          std::complex<long_double>::complex(&local_178,lVar1,lVar1);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1b8,in_RDI,local_20,local_158);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1f8,in_RDI,local_150,local_158)
          ;
          std::conj<long_double>(in_stack_fffffffffffffcb0);
          std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc82,uVar9),pcVar7);
          std::complex<long_double>::operator+=
                    ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc82,uVar9),pcVar7);
          pcVar8 = local_20;
          in_stack_fffffffffffffcc0 = local_150;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_238,in_RDI,local_20,local_150);
          std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc82,uVar9),pcVar7);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,pcVar8,in_stack_fffffffffffffcc0,local_218);
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(&local_258,in_RDI,local_20,local_20);
        local_278 = local_258;
        local_270 = local_250;
        local_268 = local_248;
        local_260 = local_240;
        uVar9 = (undefined2)local_250;
        in_stack_fffffffffffffc82 = (undefined6)((ulong)local_250 >> 0x10);
        a._M_value._8_8_ = in_stack_fffffffffffffcc8;
        a._M_value._0_8_ = in_stack_fffffffffffffcc0;
        a._M_value._16_8_ = in_stack_fffffffffffffcd0;
        a._M_value._24_8_ = iVar5;
        pcVar8 = local_258;
        bVar3 = IsZero(a);
        if (bVar3) {
          Error(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        }
        pcVar2 = local_20;
        pcVar7 = local_150;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2b8,in_RDI,local_20,local_150);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2d8,in_RDI,local_20,local_20);
        std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc82,uVar9),pcVar8);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pcVar2,pcVar7,local_298);
        pcVar8 = local_150;
        in_stack_fffffffffffffcb0 = local_20;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_318,in_RDI,local_20,local_150);
        std::conj<long_double>(in_stack_fffffffffffffcb0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,pcVar8,in_stack_fffffffffffffcb0,local_2f8);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}